

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssp_blas2.c
# Opt level: O2

int sp_sgemv(char *trans,float alpha,SuperMatrix *A,float *x,int incx,float beta,float *y,int incy)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  float *pfVar20;
  bool bVar21;
  float fVar22;
  char msg [256];
  
  cVar2 = *trans;
  pvVar6 = A->Store;
  lVar7 = *(long *)((long)pvVar6 + 8);
  bVar9 = true;
  if (cVar2 != 'N') {
    if ((cVar2 == 'C') || (cVar2 == 'T')) {
      bVar9 = false;
    }
    else if (cVar2 != 'n') {
      msg[0] = '\x01';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      goto LAB_0010c8b3;
    }
  }
  uVar3 = A->nrow;
  if (-1 < (int)uVar3) {
    uVar18 = A->ncol;
    lVar13 = (long)(int)uVar18;
    if (-1 < lVar13) {
      if (incx == 0) {
        msg[0] = '\x05';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
      }
      else {
        if (incy != 0) {
          if (uVar18 == 0 || uVar3 == 0) {
            return 0;
          }
          if ((((alpha == 0.0) && (!NAN(alpha))) && (beta == 1.0)) && (!NAN(beta))) {
            return 0;
          }
          uVar8 = uVar3;
          if (cVar2 == 'N') {
            uVar8 = uVar18;
            uVar18 = uVar3;
          }
          uVar3 = (1 - uVar8) * incx;
          if (0 < incx) {
            uVar3 = 0;
          }
          uVar16 = (ulong)uVar3;
          uVar3 = (1 - uVar18) * incy;
          if (0 < incy) {
            uVar3 = 0;
          }
          lVar12 = (long)incy;
          if ((beta != 1.0) || (NAN(beta))) {
            if (incy == 1) {
              if ((beta != 0.0) || (NAN(beta))) {
                for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
                  y[uVar19] = y[uVar19] * beta;
                }
              }
              else {
                for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
                  y[uVar19] = 0.0;
                }
              }
            }
            else {
              pfVar20 = y + (int)uVar3;
              if ((beta != 0.0) || (NAN(beta))) {
                while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
                  *pfVar20 = *pfVar20 * beta;
                  pfVar20 = pfVar20 + lVar12;
                }
              }
              else {
                while (bVar21 = uVar18 != 0, uVar18 = uVar18 - 1, bVar21) {
                  *pfVar20 = 0.0;
                  pfVar20 = pfVar20 + lVar12;
                }
              }
            }
          }
          if ((alpha == 0.0) && (!NAN(alpha))) {
            return 0;
          }
          if (bVar9) {
            if (incy == 1) {
              for (lVar12 = 0; lVar12 != lVar13; lVar12 = lVar12 + 1) {
                fVar22 = x[uVar16];
                if ((fVar22 != 0.0) || (NAN(fVar22))) {
                  iVar4 = *(int *)(*(long *)((long)pvVar6 + 0x18) + 4 + lVar12 * 4);
                  for (lVar14 = (long)*(int *)(*(long *)((long)pvVar6 + 0x18) + lVar12 * 4);
                      lVar14 < iVar4; lVar14 = lVar14 + 1) {
                    iVar5 = *(int *)(*(long *)((long)pvVar6 + 0x10) + lVar14 * 4);
                    y[iVar5] = *(float *)(lVar7 + lVar14 * 4) * fVar22 * alpha + y[iVar5];
                  }
                }
                uVar16 = uVar16 + (long)incx;
              }
              return 0;
            }
            uVar11 = 0x1ce;
          }
          else {
            if (incx == 1) {
              lVar10 = (long)(int)uVar3;
              lVar14 = *(long *)((long)pvVar6 + 0x18);
              lVar15 = 0;
              while (lVar15 != lVar13) {
                lVar17 = lVar15 * 4;
                lVar1 = lVar15 * 4;
                lVar15 = lVar15 + 1;
                fVar22 = 0.0;
                for (lVar17 = (long)*(int *)(lVar14 + lVar17); lVar17 < *(int *)(lVar14 + 4 + lVar1)
                    ; lVar17 = lVar17 + 1) {
                  fVar22 = fVar22 + *(float *)(lVar7 + lVar17 * 4) *
                                    x[*(int *)(*(long *)((long)pvVar6 + 0x10) + lVar17 * 4)];
                }
                y[lVar10] = fVar22 * alpha + y[lVar10];
                lVar10 = lVar10 + lVar12;
              }
              return 0;
            }
            uVar11 = 0x1de;
          }
          sprintf(msg,"%s at line %d in file %s\n","Not implemented.",uVar11,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/ssp_blas2.c"
                 );
          superlu_abort_and_exit(msg);
        }
        msg[0] = '\b';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
      }
      goto LAB_0010c8b3;
    }
  }
  msg[0] = '\x03';
  msg[1] = '\0';
  msg[2] = '\0';
  msg[3] = '\0';
LAB_0010c8b3:
  input_error("sp_sgemv ",(int *)msg);
  return 0;
}

Assistant:

int
sp_sgemv(char *trans, float alpha, SuperMatrix *A, float *x, 
	 int incx, float beta, float *y, int incy)
{
    /* Local variables */
    NCformat *Astore;
    float   *Aval;
    int info;
    float temp;
    int lenx, leny;
    int iy, jx, jy, kx, ky, irow;
    int_t i, j;
    int notran;

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0 )
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_sgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if (A->nrow == 0 || A->ncol == 0 || (alpha == 0. && beta == 1.))
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if (strncmp(trans, "N", 1)==0) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if (beta != 1.) {
	if (incy == 1) {
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) y[i] = 0.;
	    else
		for (i = 0; i < leny; ++i) y[i] = beta * y[i];
	} else {
	    iy = ky;
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) {
		    y[iy] = 0.;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    y[iy] = beta * y[iy];
		    iy += incy;
		}
	}
    }
    
    if (alpha == 0.) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if (x[jx] != 0.) {
		    temp = alpha * x[jx];
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			y[irow] += temp * Aval[i];
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp += Aval[i] * x[irow];
		}
		y[jy] += alpha * temp;
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;
}